

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

bool __thiscall Assimp::ASE::Parser::SkipToNextToken(Parser *this)

{
  byte bVar1;
  bool bVar2;
  byte in_AL;
  byte *pbVar3;
  uint uVar4;
  byte bVar5;
  
  pbVar3 = (byte *)this->filePtr;
  bVar5 = this->bLastWasEndLine;
  uVar4 = this->iLineNumber;
  do {
    bVar1 = *pbVar3;
    if (((bVar1 < 0xe) && ((0x3401U >> (bVar1 & 0x1f) & 1) != 0)) && ((bVar5 & 1) == 0)) {
      uVar4 = uVar4 + 1;
      this->iLineNumber = uVar4;
      this->bLastWasEndLine = true;
      bVar5 = 1;
    }
    else {
      this->bLastWasEndLine = false;
      bVar5 = 0;
    }
    bVar2 = false;
    if (bVar1 < 0x7b) {
      if (bVar1 == 0) {
        in_AL = 0;
        bVar2 = false;
      }
      else {
        if (bVar1 == 0x2a) goto LAB_003f69d3;
LAB_003f69d7:
        pbVar3 = pbVar3 + 1;
        this->filePtr = (char *)pbVar3;
        bVar2 = true;
      }
    }
    else {
      if ((bVar1 != 0x7b) && (bVar1 != 0x7d)) goto LAB_003f69d7;
LAB_003f69d3:
      in_AL = 1;
    }
    if (!bVar2) {
      return (bool)(in_AL & 1);
    }
  } while( true );
}

Assistant:

bool Parser::SkipToNextToken()
{
    while (true)
    {
        char me = *filePtr;

        // increase the line number counter if necessary
        if (IsLineEnd(me) && !bLastWasEndLine)
        {
            ++iLineNumber;
            bLastWasEndLine = true;
        }
        else bLastWasEndLine = false;
        if ('*' == me || '}' == me || '{' == me)return true;
        if ('\0' == me)return false;

        ++filePtr;
    }
}